

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.c
# Opt level: O2

size_t HUF_decompress4X_usingDTable
                 (void *dst,size_t maxDstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  byte bVar3;
  undefined2 uVar4;
  size_t sVar5;
  long lVar6;
  byte bVar7;
  BIT_DStream_status BVar8;
  BIT_DStream_status BVar9;
  BIT_DStream_status BVar10;
  BIT_DStream_status BVar11;
  int iVar12;
  undefined1 *puVar13;
  undefined1 *puVar14;
  ulong uVar15;
  size_t sVar16;
  int iVar17;
  undefined1 *puVar18;
  uint uVar19;
  ulong uVar20;
  undefined1 *puVar21;
  int iVar22;
  int iVar23;
  int in_R9D;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  uint uVar28;
  void *pvVar29;
  undefined1 *puVar30;
  BIT_DStream_t BStack_d8;
  BIT_DStream_t BStack_b0;
  BIT_DStream_t BStack_88;
  BIT_DStream_t BStack_60;
  undefined1 *puStack_38;
  
  if (*(char *)((long)DTable + 1) != '\0') {
    sVar16 = HUF_decompress4X2_usingDTable_internal(dst,maxDstSize,cSrc,cSrcSize,DTable,in_R9D);
    return sVar16;
  }
  if (9 < cSrcSize) {
    uVar24 = (ulong)*cSrc;
    uVar25 = (ulong)*(ushort *)((long)cSrc + 2);
    uVar15 = (ulong)*(ushort *)((long)cSrc + 4);
    uVar20 = uVar15 + 6 + uVar24 + uVar25;
    sVar16 = 0xffffffffffffffec;
    if (uVar20 <= cSrcSize) {
      uVar4 = *(undefined2 *)((long)DTable + 2);
      sVar16 = BIT_initDStream(&BStack_60,(void *)((long)cSrc + 6),uVar24);
      if (sVar16 < 0xffffffffffffff89) {
        pvVar29 = (void *)((long)cSrc + uVar24 + 6);
        sVar16 = BIT_initDStream(&BStack_88,pvVar29,uVar25);
        if (sVar16 < 0xffffffffffffff89) {
          pvVar29 = (void *)((long)pvVar29 + uVar25);
          sVar16 = BIT_initDStream(&BStack_b0,pvVar29,uVar15);
          if ((sVar16 < 0xffffffffffffff89) &&
             (sVar16 = BIT_initDStream(&BStack_d8,(void *)((long)pvVar29 + uVar15),cSrcSize - uVar20
                                      ), sVar16 < 0xffffffffffffff89)) {
            uVar20 = maxDstSize + 3 >> 2;
            puVar2 = (undefined1 *)((long)dst + uVar20);
            puVar13 = puVar2 + uVar20;
            puVar14 = puVar13 + uVar20;
            BVar8 = BIT_reloadDStream(&BStack_60);
            BVar9 = BIT_reloadDStream(&BStack_88);
            BVar10 = BIT_reloadDStream(&BStack_b0);
            BVar11 = BIT_reloadDStream(&BStack_d8);
            puVar1 = (undefined1 *)((long)dst + maxDstSize) + -3;
            bVar7 = -(char)uVar4;
            lVar6 = uVar20 * 3;
            puStack_38 = (undefined1 *)((long)dst + maxDstSize);
            for (; (puVar30 = (undefined1 *)((long)dst + lVar6),
                   (BVar11 == BIT_DStream_unfinished && BVar10 == BIT_DStream_unfinished) &&
                   (BVar9 == BIT_DStream_unfinished && BVar8 == BIT_DStream_unfinished) &&
                   (puVar30 < puVar1)); dst = (void *)((long)dst + 4)) {
              uVar15 = (BStack_60.bitContainer << ((byte)BStack_60.bitsConsumed & 0x3f)) >>
                       (bVar7 & 0x3f);
              bVar3 = *(byte *)((long)DTable + uVar15 * 2 + 5);
              *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
              uVar15 = (BStack_88.bitContainer << ((byte)BStack_88.bitsConsumed & 0x3f)) >>
                       (bVar7 & 0x3f);
              iVar12 = bVar3 + BStack_60.bitsConsumed;
              iVar17 = *(byte *)((long)DTable + uVar15 * 2 + 5) + BStack_88.bitsConsumed;
              *(undefined1 *)((long)dst + uVar20) = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
              uVar15 = (BStack_b0.bitContainer << ((byte)BStack_b0.bitsConsumed & 0x3f)) >>
                       (bVar7 & 0x3f);
              iVar22 = *(byte *)((long)DTable + uVar15 * 2 + 5) + BStack_b0.bitsConsumed;
              *(undefined1 *)((long)dst + uVar20 * 2) =
                   *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
              uVar24 = (BStack_d8.bitContainer << ((byte)BStack_d8.bitsConsumed & 0x3f)) >>
                       (bVar7 & 0x3f);
              uVar25 = (BStack_60.bitContainer << ((byte)iVar12 & 0x3f)) >> (bVar7 & 0x3f);
              iVar23 = *(byte *)((long)DTable + uVar24 * 2 + 5) + BStack_d8.bitsConsumed;
              uVar15 = (BStack_88.bitContainer << ((byte)iVar17 & 0x3f)) >> (bVar7 & 0x3f);
              uVar26 = (BStack_b0.bitContainer << ((byte)iVar22 & 0x3f)) >> (bVar7 & 0x3f);
              *(undefined1 *)((long)dst + lVar6) = *(undefined1 *)((long)DTable + uVar24 * 2 + 4);
              iVar12 = (uint)*(byte *)((long)DTable + uVar25 * 2 + 5) + iVar12;
              *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar25 * 2 + 4);
              iVar17 = (uint)*(byte *)((long)DTable + uVar15 * 2 + 5) + iVar17;
              *(undefined1 *)((long)dst + uVar20 + 1) =
                   *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
              iVar22 = (uint)*(byte *)((long)DTable + uVar26 * 2 + 5) + iVar22;
              *(undefined1 *)((long)dst + uVar20 * 2 + 1) =
                   *(undefined1 *)((long)DTable + uVar26 * 2 + 4);
              uVar15 = (BStack_d8.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar7 & 0x3f);
              uVar24 = (BStack_60.bitContainer << ((byte)iVar12 & 0x3f)) >> (bVar7 & 0x3f);
              iVar23 = (uint)*(byte *)((long)DTable + uVar15 * 2 + 5) + iVar23;
              uVar25 = (BStack_88.bitContainer << ((byte)iVar17 & 0x3f)) >> (bVar7 & 0x3f);
              *(undefined1 *)((long)dst + lVar6 + 1) =
                   *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
              iVar12 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 5) + iVar12;
              *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar24 * 2 + 4);
              iVar17 = (uint)*(byte *)((long)DTable + uVar25 * 2 + 5) + iVar17;
              uVar15 = (BStack_b0.bitContainer << ((byte)iVar22 & 0x3f)) >> (bVar7 & 0x3f);
              *(undefined1 *)((long)dst + uVar20 + 2) =
                   *(undefined1 *)((long)DTable + uVar25 * 2 + 4);
              iVar22 = (uint)*(byte *)((long)DTable + uVar15 * 2 + 5) + iVar22;
              *(undefined1 *)((long)dst + uVar20 * 2 + 2) =
                   *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
              uVar15 = (BStack_d8.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar7 & 0x3f);
              iVar23 = (uint)*(byte *)((long)DTable + uVar15 * 2 + 5) + iVar23;
              *(undefined1 *)((long)dst + lVar6 + 2) =
                   *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
              uVar24 = (BStack_60.bitContainer << ((byte)iVar12 & 0x3f)) >> (bVar7 & 0x3f);
              uVar15 = (BStack_88.bitContainer << ((byte)iVar17 & 0x3f)) >> (bVar7 & 0x3f);
              uVar25 = (BStack_b0.bitContainer << ((byte)iVar22 & 0x3f)) >> (bVar7 & 0x3f);
              BStack_60.bitsConsumed = (uint)*(byte *)((long)DTable + uVar24 * 2 + 5) + iVar12;
              *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar24 * 2 + 4);
              BStack_88.bitsConsumed = (uint)*(byte *)((long)DTable + uVar15 * 2 + 5) + iVar17;
              *(undefined1 *)((long)dst + uVar20 + 3) =
                   *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
              BStack_b0.bitsConsumed = (uint)*(byte *)((long)DTable + uVar25 * 2 + 5) + iVar22;
              *(undefined1 *)((long)dst + uVar20 * 2 + 3) =
                   *(undefined1 *)((long)DTable + uVar25 * 2 + 4);
              uVar15 = (BStack_d8.bitContainer << ((byte)iVar23 & 0x3f)) >> (bVar7 & 0x3f);
              BStack_d8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar15 * 2 + 5) + iVar23;
              *(undefined1 *)((long)dst + lVar6 + 3) =
                   *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
              BIT_reloadDStream(&BStack_60);
              BIT_reloadDStream(&BStack_88);
              BIT_reloadDStream(&BStack_b0);
              BIT_reloadDStream(&BStack_d8);
            }
            puVar21 = (undefined1 *)((long)dst + uVar20);
            puVar18 = (undefined1 *)((long)dst + uVar20 * 2);
            sVar16 = 0xffffffffffffffec;
            if (puVar18 <= puVar14 && (puVar21 <= puVar13 && dst <= puVar2)) {
              while ((BVar8 = BIT_reloadDStream(&BStack_60), uVar28 = BStack_60.bitsConsumed,
                     dst < puVar2 + -3 && (BVar8 == BIT_DStream_unfinished))) {
                uVar20 = (BStack_60.bitContainer << ((byte)BStack_60.bitsConsumed & 0x3f)) >>
                         (bVar7 & 0x3f);
                iVar12 = *(byte *)((long)DTable + uVar20 * 2 + 5) + BStack_60.bitsConsumed;
                uVar15 = (BStack_60.bitContainer << ((byte)iVar12 & 0x3f)) >> (bVar7 & 0x3f);
                *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
                iVar12 = (uint)*(byte *)((long)DTable + uVar15 * 2 + 5) + iVar12;
                uVar24 = (BStack_60.bitContainer << ((byte)iVar12 & 0x3f)) >> (bVar7 & 0x3f);
                *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
                iVar12 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 5) + iVar12;
                uVar20 = (BStack_60.bitContainer << ((byte)iVar12 & 0x3f)) >> (bVar7 & 0x3f);
                *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar24 * 2 + 4);
                BStack_60.bitsConsumed = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar12;
                *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
                dst = (void *)((long)dst + 4);
              }
              for (; dst < puVar2; dst = (void *)((long)dst + 1)) {
                uVar20 = (BStack_60.bitContainer << ((byte)uVar28 & 0x3f)) >> (bVar7 & 0x3f);
                bVar3 = *(byte *)((long)DTable + uVar20 * 2 + 5);
                *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
                uVar28 = uVar28 + bVar3;
              }
              while ((BVar8 = BIT_reloadDStream(&BStack_88), uVar27 = BStack_88.bitsConsumed,
                     puVar21 < puVar13 + -3 && (BVar8 == BIT_DStream_unfinished))) {
                uVar20 = (BStack_88.bitContainer << ((byte)BStack_88.bitsConsumed & 0x3f)) >>
                         (bVar7 & 0x3f);
                iVar12 = *(byte *)((long)DTable + uVar20 * 2 + 5) + BStack_88.bitsConsumed;
                uVar15 = (BStack_88.bitContainer << ((byte)iVar12 & 0x3f)) >> (bVar7 & 0x3f);
                *puVar21 = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
                iVar12 = (uint)*(byte *)((long)DTable + uVar15 * 2 + 5) + iVar12;
                uVar24 = (BStack_88.bitContainer << ((byte)iVar12 & 0x3f)) >> (bVar7 & 0x3f);
                puVar21[1] = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
                iVar12 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 5) + iVar12;
                uVar20 = (BStack_88.bitContainer << ((byte)iVar12 & 0x3f)) >> (bVar7 & 0x3f);
                puVar21[2] = *(undefined1 *)((long)DTable + uVar24 * 2 + 4);
                BStack_88.bitsConsumed = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar12;
                puVar21[3] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
                puVar21 = puVar21 + 4;
              }
              for (; puVar21 < puVar13; puVar21 = puVar21 + 1) {
                uVar20 = (BStack_88.bitContainer << ((byte)uVar27 & 0x3f)) >> (bVar7 & 0x3f);
                bVar3 = *(byte *)((long)DTable + uVar20 * 2 + 5);
                *puVar21 = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
                uVar27 = uVar27 + bVar3;
              }
              while ((BVar8 = BIT_reloadDStream(&BStack_b0), puVar2 = puStack_38,
                     uVar19 = BStack_b0.bitsConsumed, puVar18 < puVar14 + -3 &&
                     (BVar8 == BIT_DStream_unfinished))) {
                uVar20 = (BStack_b0.bitContainer << ((byte)BStack_b0.bitsConsumed & 0x3f)) >>
                         (bVar7 & 0x3f);
                iVar12 = *(byte *)((long)DTable + uVar20 * 2 + 5) + BStack_b0.bitsConsumed;
                uVar15 = (BStack_b0.bitContainer << ((byte)iVar12 & 0x3f)) >> (bVar7 & 0x3f);
                *puVar18 = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
                iVar12 = (uint)*(byte *)((long)DTable + uVar15 * 2 + 5) + iVar12;
                uVar24 = (BStack_b0.bitContainer << ((byte)iVar12 & 0x3f)) >> (bVar7 & 0x3f);
                puVar18[1] = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
                iVar12 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 5) + iVar12;
                uVar20 = (BStack_b0.bitContainer << ((byte)iVar12 & 0x3f)) >> (bVar7 & 0x3f);
                puVar18[2] = *(undefined1 *)((long)DTable + uVar24 * 2 + 4);
                BStack_b0.bitsConsumed = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar12;
                puVar18[3] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
                puVar18 = puVar18 + 4;
              }
              for (; puVar18 < puVar14; puVar18 = puVar18 + 1) {
                uVar20 = (BStack_b0.bitContainer << ((byte)uVar19 & 0x3f)) >> (bVar7 & 0x3f);
                bVar3 = *(byte *)((long)DTable + uVar20 * 2 + 5);
                *puVar18 = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
                uVar19 = uVar19 + bVar3;
              }
              while ((BVar8 = BIT_reloadDStream(&BStack_d8), puVar30 < puVar1 &&
                     (BVar8 == BIT_DStream_unfinished))) {
                uVar20 = (BStack_d8.bitContainer << ((byte)BStack_d8.bitsConsumed & 0x3f)) >>
                         (bVar7 & 0x3f);
                iVar12 = *(byte *)((long)DTable + uVar20 * 2 + 5) + BStack_d8.bitsConsumed;
                uVar24 = (BStack_d8.bitContainer << ((byte)iVar12 & 0x3f)) >> (bVar7 & 0x3f);
                *puVar30 = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
                iVar12 = (uint)*(byte *)((long)DTable + uVar24 * 2 + 5) + iVar12;
                uVar15 = (BStack_d8.bitContainer << ((byte)iVar12 & 0x3f)) >> (bVar7 & 0x3f);
                puVar30[1] = *(undefined1 *)((long)DTable + uVar24 * 2 + 4);
                iVar12 = (uint)*(byte *)((long)DTable + uVar15 * 2 + 5) + iVar12;
                uVar20 = (BStack_d8.bitContainer << ((byte)iVar12 & 0x3f)) >> (bVar7 & 0x3f);
                puVar30[2] = *(undefined1 *)((long)DTable + uVar15 * 2 + 4);
                BStack_d8.bitsConsumed = (uint)*(byte *)((long)DTable + uVar20 * 2 + 5) + iVar12;
                puVar30[3] = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
                puVar30 = puVar30 + 4;
              }
              for (; puVar30 < puVar2; puVar30 = puVar30 + 1) {
                uVar20 = (BStack_d8.bitContainer << ((byte)BStack_d8.bitsConsumed & 0x3f)) >>
                         (bVar7 & 0x3f);
                BStack_d8.bitsConsumed =
                     BStack_d8.bitsConsumed + *(byte *)((long)DTable + uVar20 * 2 + 5);
                *puVar30 = *(undefined1 *)((long)DTable + uVar20 * 2 + 4);
              }
              sVar5 = 0xffffffffffffffec;
              if (BStack_d8.bitsConsumed != 0x40) {
                maxDstSize = sVar5;
              }
              if (BStack_d8.ptr != BStack_d8.start) {
                maxDstSize = sVar5;
              }
              if (uVar19 != 0x40) {
                maxDstSize = sVar5;
              }
              if (BStack_b0.ptr != BStack_b0.start) {
                maxDstSize = sVar5;
              }
              if (uVar27 != 0x40) {
                maxDstSize = sVar5;
              }
              if (BStack_88.ptr != BStack_88.start) {
                maxDstSize = sVar5;
              }
              if (uVar28 != 0x40) {
                maxDstSize = sVar5;
              }
              sVar16 = maxDstSize;
              if (BStack_60.ptr != BStack_60.start) {
                sVar16 = sVar5;
              }
            }
          }
        }
      }
    }
    return sVar16;
  }
  return 0xffffffffffffffec;
}

Assistant:

size_t HUF_decompress4X_usingDTable(void* dst, size_t maxDstSize,
                                    const void* cSrc, size_t cSrcSize,
                                    const HUF_DTable* DTable)
{
    DTableDesc const dtd = HUF_getDTableDesc(DTable);
#if defined(HUF_FORCE_DECOMPRESS_X1)
    (void)dtd;
    assert(dtd.tableType == 0);
    return HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
#elif defined(HUF_FORCE_DECOMPRESS_X2)
    (void)dtd;
    assert(dtd.tableType == 1);
    return HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
#else
    return dtd.tableType ? HUF_decompress4X2_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0) :
                           HUF_decompress4X1_usingDTable_internal(dst, maxDstSize, cSrc, cSrcSize, DTable, /* bmi2 */ 0);
#endif
}